

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O1

void __thiscall opencollada::Dae::readFile(Dae *this,string *path)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long *plVar3;
  XmlNodeSet *pXVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  istream *piVar7;
  long *plVar8;
  _xmlNode *p_Var9;
  _xmlAttr *p_Var10;
  xmlNode *pxVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  xmlNodePtr pxVar14;
  iterator iVar15;
  string buffer;
  XmlNode instance;
  XmlAttribute url;
  stringstream ss;
  undefined1 local_5c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  size_t local_588;
  iterator local_580;
  undefined1 local_570 [24];
  _xmlNode *local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  XmlNode local_540;
  _xmlNode *local_538;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  _Alloc_hider local_500;
  char local_4f0 [16];
  _Alloc_hider local_4e0;
  char local_4d0 [16];
  _Alloc_hider local_4c0;
  char local_4b0 [16];
  _Alloc_hider local_4a0;
  char local_490 [16];
  _Alloc_hider local_480;
  char local_470 [16];
  bool local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  XmlNode local_d8;
  long local_d0;
  xmlNode local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Uri::FromNativePath((Uri *)local_520,path);
  ::std::__cxx11::string::operator=((string *)&this->mUri,(string *)local_520);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mScheme,(string *)&local_500);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mAuthority,(string *)&local_4e0);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mPath,(string *)&local_4c0);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mQuery,(string *)&local_4a0);
  ::std::__cxx11::string::operator=((string *)&(this->mUri).mFragment,(string *)&local_480);
  (this->mUri).mValid = local_460;
  if (local_480._M_p != local_470) {
    operator_delete(local_480._M_p);
  }
  if (local_4a0._M_p != local_490) {
    operator_delete(local_4a0._M_p);
  }
  if (local_4c0._M_p != local_4b0) {
    operator_delete(local_4c0._M_p);
  }
  if (local_4e0._M_p != local_4d0) {
    operator_delete(local_4e0._M_p);
  }
  if (local_500._M_p != local_4f0) {
    operator_delete(local_500._M_p);
  }
  if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
    operator_delete((void *)local_520._0_8_);
  }
  XmlDoc::readFile(&this->super_XmlDoc,path);
  bVar2 = XmlDoc::operator_cast_to_bool(&this->super_XmlDoc);
  if (bVar2) {
    local_c8.name = (xmlChar *)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Strings::instance_animation_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_50,xpath_or_all_abi_cxx11_);
    local_378 = &local_368;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_368 = *plVar8;
      lStack_360 = plVar3[3];
    }
    else {
      local_368 = *plVar8;
      local_378 = (long *)*plVar3;
    }
    local_370 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_378,Strings::instance_camera_abi_cxx11_);
    local_358 = &local_348;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_348 = *plVar8;
      lStack_340 = plVar3[3];
    }
    else {
      local_348 = *plVar8;
      local_358 = (long *)*plVar3;
    }
    local_350 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_358,xpath_or_all_abi_cxx11_);
    local_338 = &local_328;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_328 = *plVar8;
      lStack_320 = plVar3[3];
    }
    else {
      local_328 = *plVar8;
      local_338 = (long *)*plVar3;
    }
    local_330 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_338,Strings::instance_controller_abi_cxx11_);
    local_318 = &local_308;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_308 = *plVar8;
      lStack_300 = plVar3[3];
    }
    else {
      local_308 = *plVar8;
      local_318 = (long *)*plVar3;
    }
    local_310 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_318,xpath_or_all_abi_cxx11_);
    local_2f8 = &local_2e8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_2e8 = *plVar8;
      lStack_2e0 = plVar3[3];
    }
    else {
      local_2e8 = *plVar8;
      local_2f8 = (long *)*plVar3;
    }
    local_2f0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_2f8,Strings::instance_effect_abi_cxx11_);
    local_2d8 = &local_2c8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_2c8 = *plVar8;
      lStack_2c0 = plVar3[3];
    }
    else {
      local_2c8 = *plVar8;
      local_2d8 = (long *)*plVar3;
    }
    local_2d0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_2d8,xpath_or_all_abi_cxx11_);
    local_2b8 = &local_2a8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_2a8 = *plVar8;
      lStack_2a0 = plVar3[3];
    }
    else {
      local_2a8 = *plVar8;
      local_2b8 = (long *)*plVar3;
    }
    local_2b0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_2b8,Strings::instance_force_field_abi_cxx11_);
    local_298 = &local_288;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_288 = *plVar8;
      lStack_280 = plVar3[3];
    }
    else {
      local_288 = *plVar8;
      local_298 = (long *)*plVar3;
    }
    local_290 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_298,xpath_or_all_abi_cxx11_);
    local_278 = &local_268;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar3[3];
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar3;
    }
    local_270 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_278,Strings::instance_formula_abi_cxx11_);
    local_258 = &local_248;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_248 = *plVar8;
      lStack_240 = plVar3[3];
    }
    else {
      local_248 = *plVar8;
      local_258 = (long *)*plVar3;
    }
    local_250 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_258,xpath_or_all_abi_cxx11_);
    local_238 = &local_228;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_228 = *plVar8;
      lStack_220 = plVar3[3];
    }
    else {
      local_228 = *plVar8;
      local_238 = (long *)*plVar3;
    }
    local_230 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_238,Strings::instance_geometry_abi_cxx11_);
    local_218 = &local_208;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_208 = *plVar8;
      lStack_200 = plVar3[3];
    }
    else {
      local_208 = *plVar8;
      local_218 = (long *)*plVar3;
    }
    local_210 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_218,xpath_or_all_abi_cxx11_);
    local_1f8 = &local_1e8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_1e8 = *plVar8;
      lStack_1e0 = plVar3[3];
    }
    else {
      local_1e8 = *plVar8;
      local_1f8 = (long *)*plVar3;
    }
    local_1f0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_1f8,Strings::instance_image_abi_cxx11_);
    local_1d8 = &local_1c8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_1c8 = *plVar8;
      lStack_1c0 = plVar3[3];
    }
    else {
      local_1c8 = *plVar8;
      local_1d8 = (long *)*plVar3;
    }
    local_1d0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_1d8,xpath_or_all_abi_cxx11_);
    p_Var9 = (_xmlNode *)(plVar3 + 2);
    if ((_xmlNode *)*plVar3 == p_Var9) {
      local_c8.parent = (_xmlNode *)p_Var9->_private;
      local_c8.next = (_xmlNode *)plVar3[3];
      local_c8.children = (_xmlNode *)&local_c8.parent;
    }
    else {
      local_c8.parent = (_xmlNode *)p_Var9->_private;
      local_c8.children = (_xmlNode *)*plVar3;
    }
    local_c8.last = (_xmlNode *)plVar3[1];
    *plVar3 = (long)p_Var9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_c8.children,Strings::instance_joint_abi_cxx11_);
    local_1b8 = &local_1a8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_1a8 = *plVar8;
      lStack_1a0 = plVar3[3];
    }
    else {
      local_1a8 = *plVar8;
      local_1b8 = (long *)*plVar3;
    }
    local_1b0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_1b8,xpath_or_all_abi_cxx11_);
    local_198 = &local_188;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_188 = *plVar8;
      lStack_180 = plVar3[3];
    }
    else {
      local_188 = *plVar8;
      local_198 = (long *)*plVar3;
    }
    local_190 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_198,Strings::instance_kinematics_model_abi_cxx11_);
    local_178 = &local_168;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_168 = *plVar8;
      lStack_160 = plVar3[3];
    }
    else {
      local_168 = *plVar8;
      local_178 = (long *)*plVar3;
    }
    local_170 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_178,xpath_or_all_abi_cxx11_);
    p_Var9 = (_xmlNode *)(plVar3 + 2);
    if ((_xmlNode *)*plVar3 == p_Var9) {
      local_c8.ns = (xmlNs *)p_Var9->_private;
      local_c8.content = (xmlChar *)plVar3[3];
      local_c8.prev = (_xmlNode *)&local_c8.ns;
    }
    else {
      local_c8.ns = (xmlNs *)p_Var9->_private;
      local_c8.prev = (_xmlNode *)*plVar3;
    }
    local_c8.doc = (_xmlDoc *)plVar3[1];
    *plVar3 = (long)p_Var9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_c8.prev,Strings::instance_kinematics_scene_abi_cxx11_
                               );
    local_158 = &local_148;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_148 = *plVar8;
      lStack_140 = plVar3[3];
    }
    else {
      local_148 = *plVar8;
      local_158 = (long *)*plVar3;
    }
    local_150 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_158,xpath_or_all_abi_cxx11_);
    local_138 = &local_128;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_128 = *plVar8;
      lStack_120 = plVar3[3];
    }
    else {
      local_128 = *plVar8;
      local_138 = (long *)*plVar3;
    }
    local_130 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_138,Strings::instance_light_abi_cxx11_);
    local_118 = &local_108;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_108 = *plVar8;
      lStack_100 = plVar3[3];
    }
    else {
      local_108 = *plVar8;
      local_118 = (long *)*plVar3;
    }
    local_110 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_118,xpath_or_all_abi_cxx11_);
    local_f8 = &local_e8;
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_e8 = *plVar8;
      lStack_e0 = plVar3[3];
    }
    else {
      local_e8 = *plVar8;
      local_f8 = (long *)*plVar3;
    }
    local_f0 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_f8,Strings::instance_node_abi_cxx11_);
    p_Var10 = (_xmlAttr *)(plVar3 + 2);
    if ((_xmlAttr *)*plVar3 == p_Var10) {
      local_c8.psvi = p_Var10->_private;
      local_c8._112_8_ = plVar3[3];
      local_c8.properties = (_xmlAttr *)&local_c8.psvi;
    }
    else {
      local_c8.psvi = p_Var10->_private;
      local_c8.properties = (_xmlAttr *)*plVar3;
    }
    local_c8.nsDef = (xmlNs *)plVar3[1];
    *plVar3 = (long)p_Var10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_c8.properties,xpath_or_all_abi_cxx11_);
    pxVar11 = (xmlNode *)(plVar3 + 2);
    if ((xmlNode *)*plVar3 == pxVar11) {
      local_c8._private = pxVar11->_private;
      local_c8._8_8_ = plVar3[3];
      local_d8.mNode = &local_c8;
    }
    else {
      local_c8._private = pxVar11->_private;
      local_d8.mNode = (xmlNode *)*plVar3;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)pxVar11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_d8,Strings::instance_physics_material_abi_cxx11_);
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    psVar12 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_398.field_2._M_allocated_capacity = *psVar12;
      local_398.field_2._8_8_ = plVar3[3];
    }
    else {
      local_398.field_2._M_allocated_capacity = *psVar12;
      local_398._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_398._M_string_length = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_398,xpath_or_all_abi_cxx11_);
    local_540.mNode = (xmlNodePtr)local_530;
    p_Var9 = (_xmlNode *)(plVar3 + 2);
    if ((_xmlNode *)*plVar3 == p_Var9) {
      local_530._0_8_ = p_Var9->_private;
      local_530._8_8_ = plVar3[3];
    }
    else {
      local_530._0_8_ = p_Var9->_private;
      local_540.mNode = (_xmlNode *)*plVar3;
    }
    local_538 = (_xmlNode *)plVar3[1];
    *plVar3 = (long)p_Var9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_540,Strings::instance_physics_model_abi_cxx11_);
    local_570._16_8_ = &local_550;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar13) {
      local_550._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_550._8_8_ = plVar3[3];
    }
    else {
      local_550._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_570._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar3;
    }
    local_558 = (_xmlNode *)plVar3[1];
    *plVar3 = (long)paVar13;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_570 + 0x10,xpath_or_all_abi_cxx11_);
    local_580.mNodeSet = (xmlNodeSetPtr)local_570;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_570._0_8_ = pxVar14->_private;
      local_570._8_8_ = plVar3[3];
    }
    else {
      local_570._0_8_ = pxVar14->_private;
      local_580.mNodeSet = (xmlNodeSetPtr)*plVar3;
    }
    local_580._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_580,Strings::instance_physics_scene_abi_cxx11_);
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    psVar12 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_5a8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_or_all_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               (local_5c8,Strings::instance_visual_scene_abi_cxx11_);
    local_520._0_8_ = local_520 + 0x10;
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes((XmlNode *)&local_c8.name,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if ((xmlNodePtr)local_580.mNodeSet != (xmlNodePtr)local_570) {
      operator_delete(local_580.mNodeSet);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._16_8_ != &local_550) {
      operator_delete((void *)local_570._16_8_);
    }
    if (local_540.mNode != (_xmlNode *)local_530) {
      operator_delete(local_540.mNode);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    if (local_d8.mNode != &local_c8) {
      operator_delete(local_d8.mNode);
    }
    if (local_c8.properties != (_xmlAttr *)&local_c8.psvi) {
      operator_delete(local_c8.properties);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if (local_c8.prev != (_xmlNode *)&local_c8.ns) {
      operator_delete(local_c8.prev);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8);
    }
    if (local_c8.children != (_xmlNode *)&local_c8.parent) {
      operator_delete(local_c8.children);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338);
    }
    if (local_358 != &local_348) {
      operator_delete(local_358);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::url_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Strings::instance_node_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::proxy_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_540 = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_570 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::accessor_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)(local_570 + 0x10),xpath_or_all_abi_cxx11_);
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_570._0_8_ = pxVar14->_private;
      local_570._8_8_ = plVar3[3];
      local_580.mNodeSet = (xmlNodeSetPtr)local_570;
    }
    else {
      local_570._0_8_ = pxVar14->_private;
      local_580.mNodeSet = (xmlNodeSetPtr)*plVar3;
    }
    local_580._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_580,Strings::skin_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8.field_2._8_8_ = plVar3[3];
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_5a8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_or_all_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_5c8,Strings::morph_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes(&local_540,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if ((xmlNodePtr)local_580.mNodeSet != (xmlNodePtr)local_570) {
      operator_delete(local_580.mNodeSet);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._16_8_ != &local_550) {
      operator_delete((void *)local_570._16_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::source_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::render_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_520._0_8_ = local_520 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"camera_node","");
        local_570._16_8_ = XmlNode::attribute((XmlNode *)&local_580,(string *)local_520);
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_);
        }
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          sVar5 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,sVar5,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::skeleton_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        sVar5 = XmlNode::line((XmlNode *)&local_580);
        XmlNode::text_abi_cxx11_((string *)local_520,(XmlNode *)&local_580);
        onAnyDAEURI(this,sVar5,(string *)local_520);
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_);
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_580.mNodeSet = (xmlNodeSetPtr)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Strings::instance_material_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_or_all_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               (local_5c8,Strings::instance_rigid_body_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes((XmlNode *)&local_580,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::target_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Strings::instance_physics_model_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::parent_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::convex_mesh_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::convex_hull_of_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyDAEURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    p_Var6 = (this->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        Uri::nativePath_abi_cxx11_((string *)local_520,(Uri *)(p_Var6 + 1));
        XmlDoc::readFile((XmlDoc *)&p_Var6[7]._M_parent,(string *)local_520);
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_);
        }
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    local_580.mNodeSet = (xmlNodeSetPtr)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::image_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_child_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_5c8,Strings::init_from_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes((XmlNode *)&local_580,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        sVar5 = XmlNode::line((XmlNode *)&local_580);
        XmlNode::text_abi_cxx11_((string *)local_520,(XmlNode *)&local_580);
        onAnyURI(this,sVar5,(string *)local_520);
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_);
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_d8 = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::binary_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_398,xpath_child_abi_cxx11_);
    p_Var9 = (_xmlNode *)(plVar3 + 2);
    if ((_xmlNode *)*plVar3 == p_Var9) {
      local_530._0_8_ = p_Var9->_private;
      local_530._8_8_ = plVar3[3];
      local_540.mNode = (_xmlNode *)local_530;
    }
    else {
      local_530._0_8_ = p_Var9->_private;
      local_540.mNode = (_xmlNode *)*plVar3;
    }
    local_538 = (_xmlNode *)plVar3[1];
    *plVar3 = (long)p_Var9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_540,Strings::ref_abi_cxx11_);
    local_570._16_8_ = &local_550;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar13) {
      local_550._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_550._8_8_ = plVar3[3];
    }
    else {
      local_550._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_570._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar3;
    }
    local_558 = (_xmlNode *)plVar3[1];
    *plVar3 = (long)paVar13;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_570 + 0x10,xpath_or_all_abi_cxx11_);
    local_580.mNodeSet = (xmlNodeSetPtr)local_570;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_570._0_8_ = pxVar14->_private;
      local_570._8_8_ = plVar3[3];
    }
    else {
      local_570._0_8_ = pxVar14->_private;
      local_580.mNodeSet = (xmlNodeSetPtr)*plVar3;
    }
    local_580._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_580,Strings::init_from_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8.field_2._8_8_ = plVar3[3];
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_5a8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_child_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_5c8,Strings::ref_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes(&local_d8,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if ((xmlNodePtr)local_580.mNodeSet != (xmlNodePtr)local_570) {
      operator_delete(local_580.mNodeSet);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._16_8_ != &local_550) {
      operator_delete((void *)local_570._16_8_);
    }
    if (local_540.mNode != (_xmlNode *)local_530) {
      operator_delete(local_540.mNode);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        sVar5 = XmlNode::line((XmlNode *)&local_580);
        XmlNode::text_abi_cxx11_((string *)local_520,(XmlNode *)&local_580);
        onAnyURI(this,sVar5,(string *)local_520);
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_);
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_580.mNodeSet = (xmlNodeSetPtr)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::include_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_or_all_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_5c8,Strings::profile_BRIDGE_abi_cxx11_)
    ;
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes((XmlNode *)&local_580,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::url_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_580.mNodeSet = (xmlNodeSetPtr)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::channel_abi_cxx11_);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_5a8,xpath_or_all_abi_cxx11_);
    local_5c8._0_8_ = local_5c8 + 0x10;
    pxVar14 = (xmlNodePtr)(plVar3 + 2);
    if ((xmlNodePtr)*plVar3 == pxVar14) {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._24_8_ = plVar3[3];
    }
    else {
      local_5c8._16_8_ = pxVar14->_private;
      local_5c8._0_8_ = (xmlNodePtr)*plVar3;
    }
    local_5c8._8_8_ = plVar3[1];
    *plVar3 = (long)pxVar14;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::_M_append(local_5c8,Strings::input_abi_cxx11_);
    psVar12 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar12) {
      local_520._16_8_ = *psVar12;
      local_520._24_8_ = plVar3[3];
      local_520._0_8_ = local_520 + 0x10;
    }
    else {
      local_520._16_8_ = *psVar12;
      local_520._0_8_ = (size_type *)*plVar3;
    }
    local_520._8_8_ = plVar3[1];
    *plVar3 = (long)psVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pXVar4 = XmlNode::selectNodes((XmlNode *)&local_580,(string *)local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5c8._0_8_ = iVar15.mNodeSet;
    local_5c8._8_4_ = iVar15.mIndex;
    iVar15 = XmlNodeSet::end(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
    if (bVar2) {
      do {
        local_580.mNodeSet = (xmlNodeSetPtr)XmlNodeSet::iterator::operator*((iterator *)local_5c8);
        local_570._16_8_ =
             XmlNode::attribute((XmlNode *)&local_580,(string *)Strings::source_abi_cxx11_);
        bVar2 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)(local_570 + 0x10));
        if (bVar2) {
          local_588 = XmlNode::line((XmlNode *)&local_580);
          XmlAttribute::value_abi_cxx11_((string *)local_520,(XmlAttribute *)(local_570 + 0x10));
          onAnyURI(this,local_588,(string *)local_520);
          if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
            operator_delete((void *)local_520._0_8_);
          }
        }
        XmlNodeSet::iterator::operator++((iterator *)local_5c8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)local_5c8,(iterator *)&local_5a8);
      } while (bVar2);
    }
    local_5c8._0_8_ = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::IDREF_array_abi_cxx11_);
    pXVar4 = XmlNode::selectNodes
                       ((XmlNode *)local_5c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_520);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_);
    }
    iVar15 = XmlNodeSet::begin(pXVar4);
    local_5a8._M_dataplus._M_p = (pointer)iVar15.mNodeSet;
    local_5a8._M_string_length = CONCAT44(local_5a8._M_string_length._4_4_,iVar15.mIndex);
    iVar15 = XmlNodeSet::end(pXVar4);
    local_580.mNodeSet = iVar15.mNodeSet;
    local_580.mIndex = iVar15.mIndex;
    bVar2 = XmlNodeSet::iterator::operator!=((iterator *)&local_5a8,&local_580);
    if (bVar2) {
      do {
        local_570._16_8_ = XmlNodeSet::iterator::operator*((iterator *)&local_5a8);
        XmlNode::text_abi_cxx11_((string *)local_5c8,(XmlNode *)(local_570 + 0x10));
        ::std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_520,(string *)local_5c8,_S_out|_S_in);
        if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
          operator_delete((void *)local_5c8._0_8_);
        }
        local_5c8._0_8_ = local_5c8 + 0x10;
        local_5c8._8_8_ = 0;
        local_5c8._16_8_ = local_5c8._16_8_ & 0xffffffffffffff00;
        while (piVar7 = ::std::operator>>((istream *)local_520,(string *)local_5c8),
              ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
          local_540.mNode = (xmlNodePtr)XmlNode::line((XmlNode *)(local_570 + 0x10));
          ::std::
          vector<std::tuple<unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string>>>
          ::emplace_back<unsigned_long,std::__cxx11::string&>
                    ((vector<std::tuple<unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string>>>
                      *)&this->mIDREFs,(unsigned_long *)&local_540,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8)
          ;
        }
        if ((xmlNodePtr)local_5c8._0_8_ != (xmlNodePtr)(local_5c8 + 0x10)) {
          operator_delete((void *)local_5c8._0_8_);
        }
        ::std::__cxx11::stringstream::~stringstream((stringstream *)local_520);
        ::std::ios_base::~ios_base((ios_base *)&local_4a0);
        XmlNodeSet::iterator::operator++((iterator *)&local_5a8);
        bVar2 = XmlNodeSet::iterator::operator!=((iterator *)&local_5a8,&local_580);
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void Dae::readFile(const string & path)
	{
		mUri = Uri::FromNativePath(path);

		Super::readFile(path);

		if (!*this)
			return;

		// List referenced DAEs

		// InstanceWithExtra and other <instance_*> with "url" attribute
		const auto & instances = root().selectNodes(
			xpath_all + Strings::instance_animation +
			xpath_or_all + Strings::instance_camera +
			xpath_or_all + Strings::instance_controller +
			xpath_or_all + Strings::instance_effect +
			xpath_or_all + Strings::instance_force_field +
			xpath_or_all + Strings::instance_formula +
			xpath_or_all + Strings::instance_geometry +
			xpath_or_all + Strings::instance_image +
			xpath_or_all + Strings::instance_joint +
			xpath_or_all + Strings::instance_kinematics_model +
			xpath_or_all + Strings::instance_kinematics_scene +
			xpath_or_all + Strings::instance_light +
			xpath_or_all + Strings::instance_node +
			xpath_or_all + Strings::instance_physics_material +
			xpath_or_all + Strings::instance_physics_model +
			xpath_or_all + Strings::instance_physics_scene +
			xpath_or_all + Strings::instance_visual_scene
		);
		for (auto instance : instances)
			if (auto url = instance.attribute(Strings::url))
				onAnyDAEURI(instance.line(), url.value());

		// <instance_node>
		const auto & instance_nodes = root().selectNodes(xpath_all + Strings::instance_node);
		for (auto instance_node : instance_nodes)
		{
			if (auto proxy = instance_node.attribute(Strings::proxy))
				onAnyDAEURI(instance_node.line(), proxy.value());
		}

		// <accessor>
		// <skin>
		// <morph>
		const auto & elementsWithSource = root().selectNodes(
			xpath_all + Strings::accessor +
			xpath_or_all + Strings::skin +
			xpath_or_all + Strings::morph
		);
		for (auto element : elementsWithSource)
		{
			if (auto source = element.attribute(Strings::source))
				onAnyDAEURI(element.line(), source.value());
		}

		// <render>
		const auto & renders = root().selectNodes(xpath_all + Strings::render);
		for (auto render : renders)
		{
			if (auto camera_node = render.attribute("camera_node"))
				onAnyDAEURI(render.line(), camera_node.value());
		}

		// <skeleton>
		const auto & skeletons = root().selectNodes(xpath_all + Strings::skeleton);
		for (auto skeleton : skeletons)
		{
			onAnyDAEURI(skeleton.line(), skeleton.text());
		}

		// <instance_material>
		// <instance_rigid_body>
		const auto & elementsWithTarget = root().selectNodes(
			xpath_all + Strings::instance_material +
			xpath_or_all + Strings::instance_rigid_body
		);
		for (auto element : elementsWithTarget)
		{
			if (auto target = element.attribute(Strings::target))
				onAnyDAEURI(element.line(), target.value());
		}

		// <instance_physics_model>
		const auto & instance_physics_models = root().selectNodes(xpath_all + Strings::instance_physics_model);
		for (auto instance_physics_model : instance_physics_models)
		{
			if (auto parent = instance_physics_model.attribute(Strings::parent))
				onAnyDAEURI(instance_physics_model.line(),  parent.value());
		}

		// <convex_mesh>
		const auto & convex_meshes = root().selectNodes(xpath_all + Strings::convex_mesh);
		for (auto convex_mesh : convex_meshes)
		{
			if (auto convex_hull_of = convex_mesh.attribute(Strings::convex_hull_of))
				onAnyDAEURI(convex_mesh.line(), convex_hull_of.value());
		}

		// TODO
		// rigid_body attribute is an sid. Make sid check.

		// <ref_attachment>
		// <attachment>
		//auto attachments = root().selectNodes(
		//	xpath_all + Strings::attachment +
		//	xpath_or_all + Strings::ref_attachment
		//);
		//for (auto attachment : attachments)
		//{
		//	if (auto rigid_body = attachment.attribute(Strings::rigid_body))
		//		onAnyDAEURI(attachment.line(), rigid_body.value());
		//}

		// Load found DAE references
		for (auto & uri_dae : mExternalDAEs)
			uri_dae.second.readExternalFile(uri_dae.first.nativePath());

		// Look for additional xs:anyURI that are not DAE references:

		// <image>/<init_from>
		const auto & init_froms = root().selectNodes(xpath_all + Strings::image + xpath_child + Strings::init_from);
		for (auto init_from : init_froms)
		{
			onAnyURI(init_from.line(), init_from.text());
		}

		// <binary>/<ref>
		// <init_from>/<ref>
		const auto & refs = root().selectNodes(
			xpath_all + Strings::binary + xpath_child + Strings::ref +
			xpath_or_all + Strings::init_from + xpath_child + Strings::ref
		);
		for (auto ref : refs)
		{
			onAnyURI(ref.line(), ref.text());
		}

		// <include>
		// <profile_BRIDGE>
		const auto & elementsWithUrl = root().selectNodes(
			xpath_all + Strings::include +
			xpath_or_all + Strings::profile_BRIDGE
		);
		for (auto element : elementsWithUrl)
		{
			if (auto url = element.attribute(Strings::url))
				onAnyURI(element.line(), url.value());
		}

		// Ignore these anyURI:
		// <COLLADA>@base
		// <contributor>/<author_website>
		// <contributor>/<source_data>

		// Look for URI fragments:

		// <channel>
		// <input>
		const auto & elementsWithSourceFragment = root().selectNodes(
			xpath_all + Strings::channel +
			xpath_or_all + Strings::input
		);
		for (auto element : elementsWithSourceFragment)
		{
			if (auto source = element.attribute(Strings::source))
				//onURIFragment(element.line(), source.value());
				onAnyURI(element.line(), source.value());
		}

		// Look for IDREFs

		// <IDREF_array>
		const auto & IDREF_arrays = root().selectNodes(xpath_all + Strings::IDREF_array);
		for (auto IDREF_array : IDREF_arrays)
		{
			stringstream ss(IDREF_array.text());
			string buffer;
			while (ss >> buffer)
				mIDREFs.emplace_back(IDREF_array.line(), buffer);
		}
	}